

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O1

string * __thiscall
AlsaBackendFactory::probe_abi_cxx11_
          (string *__return_storage_ptr__,AlsaBackendFactory *this,BackendType type)

{
  pointer pDVar1;
  pointer pDVar2;
  vector<DevMap> local_58;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_> local_38
  ;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (type == Capture) {
    anon_unknown.dwarf_259da0::probe_devices(&local_58,SND_PCM_STREAM_CAPTURE);
    local_38.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = DAT_0022e2d0;
    local_38.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = DAT_0022e2c8;
    local_38.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (anonymous_namespace)::CaptureDevices;
    (anonymous_namespace)::CaptureDevices =
         local_58.
         super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
         ._M_impl.super__Vector_impl_data._M_start;
    DAT_0022e2c8 = local_58.
                   super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    DAT_0022e2d0 = local_58.
                   super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    ~vector(&local_38);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    ~vector(&local_58);
    pDVar1 = DAT_0022e2c8;
    for (pDVar2 = (anonymous_namespace)::CaptureDevices; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1) {
      std::__cxx11::string::append
                ((char *)__return_storage_ptr__,(ulong)(pDVar2->name)._M_dataplus._M_p);
    }
  }
  else if (type == Playback) {
    anon_unknown.dwarf_259da0::probe_devices(&local_58,SND_PCM_STREAM_PLAYBACK);
    local_38.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = DAT_0022e2b0;
    local_38.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = DAT_0022e2a8;
    local_38.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (anonymous_namespace)::PlaybackDevices;
    (anonymous_namespace)::PlaybackDevices =
         local_58.
         super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
         ._M_impl.super__Vector_impl_data._M_start;
    DAT_0022e2a8 = local_58.
                   super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    DAT_0022e2b0 = local_58.
                   super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    ~vector(&local_38);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    ~vector(&local_58);
    pDVar1 = DAT_0022e2a8;
    for (pDVar2 = (anonymous_namespace)::PlaybackDevices; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1) {
      std::__cxx11::string::append
                ((char *)__return_storage_ptr__,(ulong)(pDVar2->name)._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AlsaBackendFactory::probe(BackendType type)
{
    std::string outnames;

    auto add_device = [&outnames](const DevMap &entry) -> void
    {
        /* +1 to also append the null char (to ensure a null-separated list and
         * double-null terminated list).
         */
        outnames.append(entry.name.c_str(), entry.name.length()+1);
    };
    switch(type)
    {
    case BackendType::Playback:
        PlaybackDevices = probe_devices(SND_PCM_STREAM_PLAYBACK);
        std::for_each(PlaybackDevices.cbegin(), PlaybackDevices.cend(), add_device);
        break;

    case BackendType::Capture:
        CaptureDevices = probe_devices(SND_PCM_STREAM_CAPTURE);
        std::for_each(CaptureDevices.cbegin(), CaptureDevices.cend(), add_device);
        break;
    }

    return outnames;
}